

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_lyb.c
# Opt level: O3

LY_ERR lyb_print_data(ly_out *out,lyd_node *root,uint32_t options)

{
  lys_module **pplVar1;
  lyd_node_inner *plVar2;
  lyd_node *plVar3;
  lyd_node *plVar4;
  LY_ERR LVar5;
  lys_module *plVar6;
  lyd_ctx *lydctx;
  lylyb_ctx *lybctx;
  lysc_node *plVar7;
  lys_module *plVar8;
  lyd_node_inner *plVar9;
  ly_ctx *ctx;
  ulong uVar10;
  uint8_t zero;
  char magic_number [3];
  uint8_t local_59;
  ly_set *local_58;
  lyd_node *local_50;
  lys_module *local_48;
  ulong local_40;
  lyd_node *local_38;
  
  local_59 = '\0';
  if (root == (lyd_node *)0x0) {
    ctx = (ly_ctx *)0x0;
  }
  else {
    if (root->schema == (lysc_node *)0x0) {
      plVar6 = (lys_module *)&root[2].schema;
    }
    else {
      plVar6 = root->schema->module;
    }
    ctx = plVar6->ctx;
  }
  lydctx = (lyd_ctx *)calloc(1,0x1080);
  if (lydctx != (lyd_ctx *)0x0) {
    lybctx = (lylyb_ctx *)calloc(1,0x38);
    lydctx->data_ctx = (anon_struct_24_3_37108ca1 *)lybctx;
    if (lybctx != (lylyb_ctx *)0x0) {
      lydctx->parse_opts = options;
      if (root != (lyd_node *)0x0) {
        lybctx->ctx = ctx;
        if ((root->schema != (lysc_node *)0x0) &&
           (plVar7 = lysc_data_node(root->schema->parent), plVar7 != (lysc_node *)0x0)) {
          LVar5 = LY_EINVAL;
          ly_log(lybctx->ctx,LY_LLERR,LY_EINVAL,
                 "LYB printer supports only printing top-level nodes.");
          goto LAB_0013e5d9;
        }
      }
      local_40 = CONCAT53(local_40._3_5_,0x620000);
      local_40 = CONCAT62(local_40._2_6_,0x796c);
      LVar5 = ly_write_(out,(char *)&local_40,3);
      if (LVar5 == LY_SUCCESS) {
        local_40 = CONCAT71(local_40._1_7_,5);
        LVar5 = ly_write_(out,(char *)&local_40,1);
        if ((LVar5 == LY_SUCCESS) && (LVar5 = ly_set_new(&local_58), LVar5 == LY_SUCCESS)) {
          plVar3 = root;
          plVar4 = root;
          if (root != (lyd_node *)0x0) {
LAB_0013e603:
            do {
              local_50 = plVar4;
              local_38 = plVar3;
              if (local_38->schema == (lysc_node *)0x0) {
                plVar3 = *(lyd_node **)(local_38 + 1);
                plVar4 = local_50;
                if (*(lyd_node **)(local_38 + 1) != (lyd_node *)0x0) goto LAB_0013e603;
              }
              else {
                local_48 = local_38->schema->module;
                LVar5 = ly_set_add(local_58,local_48,'\0',(uint32_t *)0x0);
                if (LVar5 != LY_SUCCESS) goto LAB_0013e72a;
                plVar6 = (lys_module *)0x0;
                while( true ) {
                  pplVar1 = local_48->deviated_by;
                  if (pplVar1 == (lys_module **)0x0) {
                    plVar8 = (lys_module *)0x0;
                  }
                  else {
                    plVar8 = pplVar1[-1];
                  }
                  if (plVar8 <= plVar6) break;
                  LVar5 = ly_set_add(local_58,pplVar1[(long)plVar6],'\0',(uint32_t *)0x0);
                  plVar6 = (lys_module *)((long)&plVar6->ctx + 1);
                  if (LVar5 != LY_SUCCESS) goto LAB_0013e72a;
                }
                plVar6 = (lys_module *)0x0;
                while( true ) {
                  pplVar1 = local_48->augmented_by;
                  if (pplVar1 == (lys_module **)0x0) {
                    plVar8 = (lys_module *)0x0;
                  }
                  else {
                    plVar8 = pplVar1[-1];
                  }
                  if (plVar8 <= plVar6) break;
                  LVar5 = ly_set_add(local_58,pplVar1[(long)plVar6],'\0',(uint32_t *)0x0);
                  plVar6 = (lys_module *)((long)&plVar6->ctx + 1);
                  if (LVar5 != LY_SUCCESS) goto LAB_0013e72a;
                }
              }
              if (local_38 != local_50) {
                plVar3 = local_38->next;
                plVar4 = local_50;
                if (local_38->next == (lyd_node *)0x0) {
                  plVar9 = local_38->parent;
                  do {
                    plVar2 = (plVar9->field_0).node.parent;
                    if (plVar2 == local_50->parent) goto LAB_0013e6f4;
                    plVar3 = (plVar9->field_0).node.next;
                    plVar9 = plVar2;
                  } while (plVar3 == (lyd_node *)0x0);
                }
                goto LAB_0013e603;
              }
LAB_0013e6f4:
              plVar3 = local_50->next;
              plVar4 = plVar3;
            } while (plVar3 != (lyd_node *)0x0);
          }
          local_40 = (ulong)local_58->count;
          LVar5 = lyb_write(out,(uint8_t *)&local_40,2,lybctx);
          if (LVar5 == LY_SUCCESS) {
            if (local_58->count != 0) {
              uVar10 = 0;
              do {
                LVar5 = lyb_print_model(out,(lys_module *)(local_58->field_2).dnodes[uVar10],'\x01',
                                        lybctx);
                if (LVar5 != LY_SUCCESS) goto LAB_0013e72a;
                uVar10 = uVar10 + 1;
              } while (uVar10 < local_58->count);
            }
            ly_set_free(local_58,(_func_void_void_ptr *)0x0);
            LVar5 = lyb_print_siblings(out,root,(lyd_lyb_ctx *)lydctx);
            if (LVar5 == LY_SUCCESS) {
              LVar5 = lyb_write(out,&local_59,1,lybctx);
            }
          }
          else {
LAB_0013e72a:
            ly_set_free(local_58,(_func_void_void_ptr *)0x0);
          }
        }
      }
      goto LAB_0013e5d9;
    }
  }
  LVar5 = LY_EMEM;
  ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyb_print_data");
LAB_0013e5d9:
  lyd_lyb_ctx_free(lydctx);
  return LVar5;
}

Assistant:

LY_ERR
lyb_print_data(struct ly_out *out, const struct lyd_node *root, uint32_t options)
{
    LY_ERR ret = LY_SUCCESS;
    uint8_t zero = 0;
    struct lyd_lyb_ctx *lybctx;
    const struct ly_ctx *ctx = root ? LYD_CTX(root) : NULL;

    lybctx = calloc(1, sizeof *lybctx);
    LY_CHECK_ERR_GOTO(!lybctx, LOGMEM(ctx); ret = LY_EMEM, cleanup);
    lybctx->lybctx = calloc(1, sizeof *lybctx->lybctx);
    LY_CHECK_ERR_GOTO(!lybctx->lybctx, LOGMEM(ctx); ret = LY_EMEM, cleanup);

    lybctx->print_options = options;
    if (root) {
        lybctx->lybctx->ctx = ctx;

        if (root->schema && lysc_data_parent(root->schema)) {
            LOGERR(lybctx->lybctx->ctx, LY_EINVAL, "LYB printer supports only printing top-level nodes.");
            ret = LY_EINVAL;
            goto cleanup;
        }
    }

    /* LYB magic number */
    LY_CHECK_GOTO(ret = lyb_print_magic_number(out), cleanup);

    /* LYB header */
    LY_CHECK_GOTO(ret = lyb_print_header(out), cleanup);

    /* all used models */
    LY_CHECK_GOTO(ret = lyb_print_data_models(out, root, lybctx->lybctx), cleanup);

    ret = lyb_print_siblings(out, root, lybctx);
    LY_CHECK_GOTO(ret, cleanup);

    /* ending zero byte */
    LY_CHECK_GOTO(ret = lyb_write(out, &zero, sizeof zero, lybctx->lybctx), cleanup);

cleanup:
    lyd_lyb_ctx_free((struct lyd_ctx *)lybctx);
    return ret;
}